

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
::
ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
::operator()(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,
            ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
            *this,Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *splitter)

{
  long lVar1;
  long lVar2;
  const_iterator it;
  array<raw_view,_16UL> ar;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_150;
  size_t local_120 [2];
  undefined1 auStack_110 [240];
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::SplitIterator(&local_150,kInitState,splitter);
  do {
    if (local_150.state_ == kEndState) {
      return __return_storage_ptr__;
    }
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      *(char **)((long)local_120 + lVar2) = local_150.curr_._M_str;
      *(size_t *)(auStack_110 + lVar2 + -8) = local_150.curr_._M_len;
      SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator++(&local_150);
      if (lVar2 == 0xf0) break;
      lVar1 = lVar2 + 0x10;
    } while (local_150.state_ != kEndState);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::operator()((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,local_120,auStack_110 + lVar2);
  } while( true );
}

Assistant:

std::vector<absl::string_view, A> operator()(
        const Splitter& splitter) const {
      struct raw_view {
        const char* data;
        size_t size;
        operator absl::string_view() const {  // NOLINT(runtime/explicit)
          return {data, size};
        }
      };
      std::vector<absl::string_view, A> v;
      std::array<raw_view, 16> ar;
      for (auto it = splitter.begin(); !it.at_end();) {
        size_t index = 0;
        do {
          ar[index].data = it->data();
          ar[index].size = it->size();
          ++it;
        } while (++index != ar.size() && !it.at_end());
        // We static_cast index to a signed type to work around overzealous
        // compiler warnings about signedness.
        v.insert(v.end(), ar.begin(),
                 ar.begin() + static_cast<ptrdiff_t>(index));
      }
      return v;
    }